

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

Status __thiscall mognetwork::TcpSocket::sendPendingDatas(TcpSocket *this)

{
  bool bVar1;
  SocketFD __fd;
  int iVar2;
  reference pcVar3;
  reference ppvVar4;
  size_type sVar5;
  ssize_t sVar6;
  size_type sVar7;
  reference pcVar8;
  vector<char,_std::allocator<char>_> *pvVar9;
  vector<char,_std::allocator<char>_> *this_00;
  size_t __n;
  Socket *in_RDI;
  size_t waiting;
  Data temp;
  iterator it;
  int sended;
  list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  *in_stack_ffffffffffffff18;
  list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
  *in_stack_ffffffffffffff20;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  value_type __x;
  size_type in_stack_ffffffffffffff48;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  vector<char,_std::allocator<char>_> local_48;
  _List_node_base *local_20;
  undefined4 in_stack_ffffffffffffffe8;
  Status local_4;
  
  bVar1 = std::__cxx11::
          list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
          ::empty((list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
                   *)(in_RDI + 1));
  if (bVar1) {
    local_4 = Nok;
  }
  else {
    local_20 = (_List_node_base *)
               std::__cxx11::
               list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
               ::begin(in_stack_ffffffffffffff18);
    __fd = Socket::getSocketFD(in_RDI);
    std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
              ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11df9a);
    pcVar3 = std::vector<char,_std::allocator<char>_>::front
                       ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20);
    ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                        ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11dfb7);
    sVar5 = std::vector<char,_std::allocator<char>_>::size(*ppvVar4);
    sVar6 = ::send(__fd,pcVar3,sVar5,0x4000);
    iVar2 = (int)sVar6;
    if (iVar2 < 0) {
      local_4 = OsSocket::getErrorStatus();
    }
    else if (iVar2 == 0) {
      local_4 = Disconnected;
    }
    else {
      sVar5 = (size_type)iVar2;
      ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                          ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e031);
      sVar7 = std::vector<char,_std::allocator<char>_>::size(*ppvVar4);
      if (sVar5 == sVar7) {
        ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                            ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e053)
        ;
        pvVar9 = *ppvVar4;
        if (pvVar9 != (vector<char,_std::allocator<char>_> *)0x0) {
          std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff40);
          operator_delete(pvVar9);
        }
        std::__cxx11::
        list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
        ::pop_front(in_stack_ffffffffffffff20);
        local_4 = sendPendingDatas((TcpSocket *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      }
      else {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)0x11e0d1);
        __x = (value_type)((ulong)in_stack_ffffffffffffff40 >> 0x38);
        ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                            ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e0de)
        ;
        std::vector<char,_std::allocator<char>_>::size(*ppvVar4);
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,__x);
        pcVar3 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                  ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e134);
        pcVar8 = std::vector<char,_std::allocator<char>_>::front
                           ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20);
        ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                            ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e15c)
        ;
        pvVar9 = (vector<char,_std::allocator<char>_> *)
                 std::vector<char,_std::allocator<char>_>::size(*ppvVar4);
        memcpy(pcVar3,pcVar8,(size_t)pvVar9);
        ppvVar4 = std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                            ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e198)
        ;
        this_00 = (vector<char,_std::allocator<char>_> *)
                  std::vector<char,_std::allocator<char>_>::size(*ppvVar4);
        __n = (long)this_00 - (long)iVar2;
        std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                  ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e1d8);
        std::vector<char,_std::allocator<char>_>::resize
                  (pvVar9,(size_type)ppvVar4,(value_type)((ulong)this_00 >> 0x38));
        std::_List_iterator<std::vector<char,_std::allocator<char>_>_*>::operator*
                  ((_List_iterator<std::vector<char,_std::allocator<char>_>_*> *)0x11e205);
        pcVar3 = std::vector<char,_std::allocator<char>_>::front
                           ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20);
        pcVar8 = std::vector<char,_std::allocator<char>_>::operator[](&local_48,0);
        memcpy(pcVar3,pcVar8,__n);
        local_4 = Ok;
        std::vector<char,_std::allocator<char>_>::~vector(this_00);
      }
    }
  }
  return local_4;
}

Assistant:

Socket::Status TcpSocket::sendPendingDatas()
  {
    //    m_mutex.lock();
    if (!m_pendingDatas.empty())
      {
	int sended;
	DataList::iterator it = m_pendingDatas.begin();
	sended = ::send(getSocketFD(), &(*it)->front(), (*it)->size(), flags);
	if (sended < 0) {
	  //	  m_mutex.unlock();
	  return (OsSocket::getErrorStatus());
	}
	if (sended == 0) {
	  //m_mutex.unlock();
	  return (Disconnected);
	}
	if ((std::size_t)sended == (*it)->size())
	  {
	    delete *it;
	    m_pendingDatas.pop_front();
	    //m_mutex.unlock();
	    return (sendPendingDatas());
	  }
	Data temp;
	temp.resize((*it)->size());
	std::memcpy(&temp[0], &(*it)->front(), (*it)->size());
	std::size_t waiting = (*it)->size() - sended;
	(*it)->resize(waiting);
	std::memcpy(&(*it)->front(), &temp[0], waiting);
	//	m_mutex.unlock();
	return (Ok);
      }
    //    m_mutex.unlock();
    return (Nok);
  }